

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_states.cpp
# Opt level: O2

void ParseFunctionParameters
               (FScanner *sc,PClassActor *cls,TArray<FxExpression_*,_FxExpression_*> *out_params,
               PFunction *afd,FString *statestring,FStateDefinitions *statedef)

{
  bool bVar1;
  FxExpression *this;
  PType **ppPVar2;
  FxConstant *this_00;
  int iVar3;
  PPrototype *pPVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  FxExpression *x;
  int local_7c;
  FScriptPosition local_78;
  Variant *local_68;
  PFunction *local_60;
  PPrototype *local_58;
  FStateDefinitions *local_50;
  FString *local_48;
  PClassActor *local_40;
  TArray<FxExpression_*,_FxExpression_*> *local_38;
  
  local_68 = (afd->Variants).Array;
  pPVar4 = local_68->Implementation->Proto;
  uVar5 = afd->Flags;
  iVar3 = (int)(uVar5 << 0x1e) >> 0x1f;
  uVar6 = (ulong)(uVar5 >> 1 & 3);
  iVar8 = iVar3 + -2;
  if ((uVar5 & 4) == 0) {
    iVar8 = iVar3;
  }
  iVar8 = iVar8 + (pPVar4->ArgumentTypes).Count;
  local_48 = statestring;
  local_40 = cls;
  local_38 = out_params;
  if (iVar8 < 0) {
    __assert_fail("numparams >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_states.cpp"
                  ,0x272,
                  "void ParseFunctionParameters(FScanner &, PClassActor *, TArray<FxExpression *> &, PFunction *, FString, FStateDefinitions *)"
                 );
  }
  local_7c = iVar8;
  local_60 = afd;
  local_58 = pPVar4;
  local_50 = statedef;
  if ((iVar8 == 0) || (((local_68->ArgFlags).Array[uVar6] & 1) != 0)) {
    bVar1 = FScanner::CheckString(sc,"(");
    if (!bVar1) {
      return;
    }
  }
  else {
    FScanner::MustGetStringName(sc,"(");
  }
  do {
    uVar5 = (uint)uVar6;
    if (iVar8 < 1) {
      if (local_7c == 0) {
        bVar1 = FScanner::CheckString(sc,")");
        if (!bVar1) {
          FScanner::ScriptError
                    (sc,"You cannot pass parameters to \'%s\'\n",
                     FName::NameData.NameArray
                     [*(int *)&(local_60->super_PSymbol).super_DObject.field_0x24].Text);
        }
      }
      else {
        FScanner::MustGetStringName(sc,")");
      }
      return;
    }
    ppPVar2 = (pPVar4->ArgumentTypes).Array;
    if ((statedef == (FStateDefinitions *)0x0) || (ppPVar2[(int)uVar5] != (PType *)TypeState)) {
LAB_005e2984:
      x = ParseParameter(sc,local_40,ppPVar2[(int)uVar5],false);
    }
    else {
      bVar1 = FScanner::CheckNumber(sc);
      if (!bVar1) {
        ppPVar2 = (pPVar4->ArgumentTypes).Array;
        goto LAB_005e2984;
      }
      iVar3 = sc->Number;
      if (iVar3 < 1) {
LAB_005e2923:
        if (iVar3 < 0) {
          FScanner::ScriptError(sc,"Negative jump offsets are not allowed");
        }
        else if (iVar3 != 0) goto LAB_005e2932;
        this_00 = (FxConstant *)operator_new(0x48);
        FScriptPosition::FScriptPosition(&local_78,sc);
        FxConstant::FxConstant(this_00,(FState *)0x0,&local_78);
        x = (FxExpression *)this_00;
        FString::~FString(&local_78.FileName);
      }
      else {
        if (1 < *(uint *)(local_48->Chars + -0xc)) {
          FScanner::ScriptError
                    (sc,
                     "You cannot use state jumps commands with a jump offset on multistate definitions\n"
                    );
          iVar3 = sc->Number;
          goto LAB_005e2923;
        }
LAB_005e2932:
        this = (FxExpression *)operator_new(0x38);
        uVar7 = (statedef->StateArray).Count;
        FScriptPosition::FScriptPosition(&local_78,sc);
        FxStateByIndex::FxStateByIndex((FxStateByIndex *)this,uVar7 + iVar3,&local_78);
        x = this;
        FString::~FString(&local_78.FileName);
        pPVar4 = local_58;
        statedef = local_50;
      }
    }
    TArray<FxExpression_*,_FxExpression_*>::Push(local_38,&x);
    uVar7 = uVar5 + 1;
    if (iVar8 == 1) {
      iVar8 = 0;
    }
    else {
      if ((pPVar4->ArgumentTypes).Array[(int)uVar7] == (PType *)0x0) {
        bVar1 = FScanner::CheckString(sc,")");
        uVar7 = uVar5;
LAB_005e2a04:
        if (bVar1 != false) {
          return;
        }
      }
      else {
        iVar8 = iVar8 + -1;
        if (((local_68->ArgFlags).Array[(int)uVar7] & 1) != 0) {
          bVar1 = FScanner::CheckString(sc,")");
          goto LAB_005e2a04;
        }
      }
      FScanner::MustGetStringName(sc,",");
    }
    uVar6 = (ulong)uVar7;
  } while( true );
}

Assistant:

void ParseFunctionParameters(FScanner &sc, PClassActor *cls, TArray<FxExpression *> &out_params,
	PFunction *afd, FString statestring, FStateDefinitions *statedef)
{
	const TArray<PType *> &params = afd->Variants[0].Implementation->Proto->ArgumentTypes;
	const TArray<DWORD> &paramflags = afd->Variants[0].ArgFlags;
	int numparams = (int)params.Size();
	int pnum = 0;
	bool zeroparm;

	if (afd->Flags & VARF_Method)
	{
		numparams--;
		pnum++;
	}
	if (afd->Flags & VARF_Action)
	{
		numparams -= 2;
		pnum += 2;
	}
	assert(numparams >= 0);
	zeroparm = numparams == 0;
	if (numparams > 0 && !(paramflags[pnum] & VARF_Optional))
	{
		sc.MustGetStringName("(");
	}
	else
	{
		if (!sc.CheckString("(")) 
		{
			return;
		}
	}
	while (numparams > 0)
	{
		FxExpression *x;
		if (statedef != NULL && params[pnum] == TypeState && sc.CheckNumber())
		{
			// Special case: State label as an offset
			if (sc.Number > 0 && statestring.Len() > 1)
			{
				sc.ScriptError("You cannot use state jumps commands with a jump offset on multistate definitions\n");
			}

			int v = sc.Number;
			if (v < 0)
			{
				sc.ScriptError("Negative jump offsets are not allowed");
			}

			if (v > 0)
			{
				x = new FxStateByIndex(statedef->GetStateCount() + v, sc);
			}
			else
			{
				x = new FxConstant((FState*)NULL, sc);
			}
		}
		else
		{
			// Use the generic parameter parser for everything else
			x = ParseParameter(sc, cls, params[pnum], false);
		}
		out_params.Push(x);
		pnum++;
		numparams--;
		if (numparams > 0)
		{
			if (params[pnum] == NULL)
			{ // varargs function
				if (sc.CheckString(")"))
				{
					return;
				}
				pnum--;
				numparams++;
			}
			else if ((paramflags[pnum] & VARF_Optional) && sc.CheckString(")"))
			{
				return;
			}
			sc.MustGetStringName (",");
		}
	}
	if (zeroparm)
	{
		if (!sc.CheckString(")"))
		{
			sc.ScriptError("You cannot pass parameters to '%s'\n", afd->SymbolName.GetChars());
		}
	}
	else
	{
		sc.MustGetStringName(")");
	}
}